

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractModuleClient.cpp
# Opt level: O0

void __thiscall AbstractModuleClient::~AbstractModuleClient(AbstractModuleClient *this)

{
  AbstractModuleClient *in_RDI;
  
  ~AbstractModuleClient(in_RDI);
  operator_delete(in_RDI,0x1b8);
  return;
}

Assistant:

AbstractModuleClient::~AbstractModuleClient() {
    this->closeConnections();
}